

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_decompress_3d.cpp
# Opt level: O2

void prediction_and_decompression_2d_with_border_prediction<float>
               (DSize_2d *size,meanInfo<float> *mean_info,double precision,int intv_radius,
               float *reg_params,uchar *indicator,int *type,float *unpredictable_data_pos,
               float *dec_data)

{
  int iVar1;
  int size_x;
  int size_y;
  float *pfVar2;
  size_t buffer_dim0_offset;
  ulong uVar3;
  ulong uVar4;
  float *dec_data_pos;
  long lVar5;
  float *buffer;
  uchar *local_78;
  float *local_68;
  int *type_pos;
  float *local_58;
  size_t local_50;
  float *local_48;
  meanInfo<float> *local_40;
  ulong local_38;
  
  dec_data_pos = dec_data;
  local_50 = size->d2 * 4 + 4;
  buffer_dim0_offset = size->d2 + 1;
  type_pos = type;
  local_40 = mean_info;
  local_58 = (float *)calloc(1,((long)size->block_size + 1) * local_50);
  uVar3 = 0;
  buffer = local_58;
  local_78 = indicator;
  local_68 = reg_params;
  while (uVar3 < size->num_x) {
    uVar4 = 0;
    local_48 = dec_data_pos;
    local_38 = uVar3;
    while( true ) {
      pfVar2 = local_58;
      iVar1 = size->block_size;
      lVar5 = (long)iVar1;
      if (size->num_y <= uVar4) break;
      size_x = (int)size->d1 - (int)local_38 * iVar1;
      if ((uVar3 + 1) * lVar5 < size->d1) {
        size_x = iVar1;
      }
      size_y = (int)size->d2 - (int)uVar4 * iVar1;
      if (lVar5 * (uVar4 + 1) < size->d2) {
        size_y = iVar1;
      }
      if (local_78[uVar4] == '\0') {
        block_pred_and_decompress_lorenzo_2d<float>
                  (local_40,buffer,precision,intv_radius,size_x,size_y,buffer_dim0_offset,
                   size->dim0_offset,&type_pos,&unpredictable_data_pos,dec_data_pos);
      }
      else {
        block_pred_and_decompress_regression_2d_with_buffer<float>
                  (local_68,buffer,precision,intv_radius,size_x,size_y,buffer_dim0_offset,
                   size->dim0_offset,&type_pos,&unpredictable_data_pos,dec_data_pos);
        local_68 = local_68 + 3;
      }
      dec_data_pos = dec_data_pos + size_y;
      buffer = buffer + size_y;
      uVar4 = uVar4 + 1;
    }
    memcpy(local_58,local_58 + buffer_dim0_offset * lVar5,local_50);
    dec_data_pos = local_48 + lVar5 * size->dim0_offset;
    local_78 = local_78 + uVar4;
    uVar3 = uVar3 + 1;
    buffer = pfVar2;
  }
  free(buffer);
  return;
}

Assistant:

void
prediction_and_decompression_2d_with_border_prediction(const DSize_2d& size, const meanInfo<T>& mean_info, double precision,
	int intv_radius, const float * reg_params, const unsigned char * indicator, 
	const int * type, const T * unpredictable_data_pos, T * dec_data){
	const int * type_pos = type;
	const unsigned char * indicator_pos = indicator;
	const float * reg_params_pos = reg_params;
	size_t buffer_dim0_offset = size.d2 + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*sizeof(T));
	T * x_data_pos = dec_data;
	for(size_t i=0; i<size.num_x; i++){
		T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
			int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
			if(*indicator_pos){
				// regression
				block_pred_and_decompress_regression_2d_with_buffer(reg_params_pos, pred_buffer_pos, precision, intv_radius, 
					size_x, size_y, buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
				reg_params_pos += RegCoeffNum2d;
			}
			else{
				// Lorenzo
				block_pred_and_decompress_lorenzo_2d(mean_info, pred_buffer_pos, precision, intv_radius, size_x, size_y, 
						buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
			}
			y_data_pos += size_y;
			pred_buffer_pos += size_y;
			indicator_pos ++;
		}
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
}